

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<unsigned_int,long>(uint expval,long val,char *exp,char *file,int line,char *func)

{
  type t;
  char *expval_00;
  type_conflict6 t_00;
  char *val_00;
  string local_78;
  string local_58;
  char *local_38;
  char *func_local;
  char *pcStack_28;
  int line_local;
  char *file_local;
  char *exp_local;
  long val_local;
  uint expval_local;
  
  if ((ulong)expval != val) {
    local_38 = func;
    func_local._4_4_ = line;
    pcStack_28 = file;
    file_local = exp;
    exp_local = (char *)val;
    val_local._4_4_ = expval;
    t = scalar_as_underlying<unsigned_int>(expval);
    flatbuffers::NumToString<unsigned_int>(&local_58,t);
    expval_00 = (char *)std::__cxx11::string::c_str();
    t_00 = scalar_as_underlying<long>((long)exp_local);
    flatbuffers::NumToString<long>(&local_78,t_00);
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,file_local,pcStack_28,func_local._4_4_,local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}